

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

PathTypeHandlerBase * __thiscall
Js::PathTypeHandlerBase::BuildPathTypeFromNewRoot
          (PathTypeHandlerBase *this,DynamicObject *instance,DynamicType **typeRef)

{
  code *pcVar1;
  ushort uVar2;
  ObjectSlotAttributes *pOVar3;
  bool bVar4;
  bool isShared;
  BYTE values;
  byte bVar5;
  uint16 uVar6;
  uint16 uVar7;
  PropertyIndex PVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  undefined4 *puVar12;
  ScriptContext *pSVar13;
  JavascriptLibrary *this_00;
  TypePath *pTVar14;
  DynamicTypeHandler *pDVar15;
  undefined4 extraout_var;
  ObjectSlotAttributes local_8d;
  PathTypeSuccessorKey PStack_54;
  PropertyIndex getterIndex;
  ObjectSlotAttributes local_49;
  int local_48;
  ushort uStack_42;
  ObjectSlotAttributes attr;
  PropertyId propertyId;
  PropertyIndex propertyIndex;
  ObjectSlotAttributes *attributes;
  PathTypeHandlerBase *newTypeHandler;
  ScriptContext *scriptContext;
  DynamicType *type;
  DynamicType **typeRef_local;
  DynamicObject *instance_local;
  PathTypeHandlerBase *this_local;
  
  type = (DynamicType *)typeRef;
  typeRef_local = (DynamicType **)instance;
  instance_local = (DynamicObject *)this;
  if (typeRef == (DynamicType **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xa94,"(typeRef)","typeRef");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  scriptContext = *(ScriptContext **)&type->super_Type;
  pSVar13 = Js::Type::GetScriptContext((Type *)scriptContext);
  newTypeHandler = (PathTypeHandlerBase *)pSVar13;
  this_00 = ScriptContext::GetLibrary(pSVar13);
  pTVar14 = JavascriptLibrary::GetRootPath(this_00);
  iVar9 = DynamicTypeHandler::GetSlotCapacity(&this->super_DynamicTypeHandler);
  uVar6 = DynamicTypeHandler::GetInlineSlotCapacity(&this->super_DynamicTypeHandler);
  uVar7 = DynamicTypeHandler::GetOffsetOfInlineSlots(&this->super_DynamicTypeHandler);
  bVar4 = DynamicTypeHandler::GetIsLocked(&this->super_DynamicTypeHandler);
  isShared = DynamicTypeHandler::GetIsShared(&this->super_DynamicTypeHandler);
  pDVar15 = (DynamicTypeHandler *)
            PathTypeHandlerNoAttr::New
                      (pSVar13,pTVar14,0,(PropertyIndex)iVar9,uVar6,uVar7,bVar4,isShared,
                       (DynamicType *)0x0);
  attributes = (ObjectSlotAttributes *)pDVar15;
  values = DynamicTypeHandler::GetFlags(&this->super_DynamicTypeHandler);
  DynamicTypeHandler::SetFlags(pDVar15,'\b',values);
  Memory::WriteBarrierPtr<Js::DynamicTypeHandler>::operator=
            ((WriteBarrierPtr<Js::DynamicTypeHandler> *)&scriptContext->jitFuncRangeCache,
             (DynamicTypeHandler *)attributes);
  iVar9 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])();
  _propertyId = CONCAT44(extraout_var,iVar9);
  uStack_42 = 0;
  do {
    uVar2 = uStack_42;
    uVar6 = GetPathLength(this);
    if (uVar6 <= uVar2) {
      uVar6 = GetPathLength((PathTypeHandlerBase *)attributes);
      uVar7 = GetPathLength(this);
      if (uVar6 != uVar7) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0xaae,"(newTypeHandler->GetPathLength() == GetPathLength())",
                                    "newTypeHandler->GetPathLength() == GetPathLength()");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      iVar9 = (**(code **)(*(undefined8 *)attributes + (ObjectSlotAttr_Int|ObjectSlotAttr_Accessor))
              )();
      iVar10 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[6])();
      if (iVar9 != iVar10) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0xaaf,
                                    "(newTypeHandler->GetPropertyCount() == GetPropertyCount())",
                                    "newTypeHandler->GetPropertyCount() == GetPropertyCount()");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      bVar5 = (**(code **)(*(undefined8 *)attributes + 0x388))();
      uVar11 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x71])();
      if ((uint)bVar5 != (uVar11 & 0xff)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0xab0,"(newTypeHandler->GetSetterCount() == GetSetterCount())",
                                    "newTypeHandler->GetSetterCount() == GetSetterCount()");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      *(ScriptContext **)&type->super_Type = scriptContext;
      return (PathTypeHandlerBase *)attributes;
    }
    local_48 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[8])
                         (this,newTypeHandler,(ulong)uStack_42);
    pSVar13 = scriptContext;
    pOVar3 = attributes;
    if (_propertyId == 0) {
      local_8d = ObjectSlotAttr_Default;
    }
    else {
      local_8d = *(ObjectSlotAttributes *)(_propertyId + (ulong)uStack_42);
    }
    local_49 = local_8d;
    PathTypeSuccessorKey::PathTypeSuccessorKey(&stack0xffffffffffffffac,local_48,local_8d);
    scriptContext =
         (ScriptContext *)
         PromoteType<false>((PathTypeHandlerBase *)pOVar3,(DynamicType *)pSVar13,PStack_54,true,
                            (ScriptContext *)newTypeHandler,(DynamicObject *)typeRef_local,
                            &stack0xffffffffffffffbe);
    pDVar15 = DynamicType::GetTypeHandler((DynamicType *)scriptContext);
    attributes = (ObjectSlotAttributes *)FromTypeHandler(pDVar15);
    if (local_49 == ObjectSlotAttr_Setter) {
      pTVar14 = GetTypePath((PathTypeHandlerBase *)attributes);
      iVar9 = local_48;
      uVar6 = GetPathLength((PathTypeHandlerBase *)attributes);
      PVar8 = TypePath::LookupInline(pTVar14,iVar9,(uint)uVar6);
      if (PVar8 == 0xffff) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0xaa7,"(getterIndex != Constants::NoSlot)",
                                    "getterIndex != Constants::NoSlot");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      pOVar3 = attributes;
      if ((*(byte *)(_propertyId + (ulong)PVar8) & 0x10) != 0) {
        uVar6 = GetPathLength((PathTypeHandlerBase *)attributes);
        (**(code **)(*(undefined8 *)pOVar3 + 0x398))(pOVar3,PVar8,(char)uVar6 + -1);
      }
    }
    uStack_42 = uStack_42 + 1;
  } while( true );
}

Assistant:

PathTypeHandlerBase *
    PathTypeHandlerBase::BuildPathTypeFromNewRoot(DynamicObject * instance, DynamicType ** typeRef)
    {
        Assert(typeRef);
        DynamicType * type = *typeRef;
        ScriptContext * scriptContext = type->GetScriptContext();

        PathTypeHandlerBase* newTypeHandler = PathTypeHandlerNoAttr::New(scriptContext, scriptContext->GetLibrary()->GetRootPath(), 0, static_cast<PropertyIndex>(this->GetSlotCapacity()), this->GetInlineSlotCapacity(), this->GetOffsetOfInlineSlots(), GetIsLocked(), GetIsShared());
        newTypeHandler->SetFlags(MayBecomeSharedFlag, GetFlags());
        type->typeHandler = newTypeHandler;

        // Promote type based on existing properties to get new type which will be cached and shared
        ObjectSlotAttributes * attributes = this->GetAttributeArray();
        for (PropertyIndex propertyIndex = 0; propertyIndex < GetPathLength(); propertyIndex++)
        {
            Js::PropertyId propertyId = GetPropertyId(scriptContext, propertyIndex);
            ObjectSlotAttributes attr = attributes ? attributes[propertyIndex] : ObjectSlotAttr_Default;
            type = newTypeHandler->PromoteType<false>(type, PathTypeSuccessorKey(propertyId, attr), true, scriptContext, instance, &propertyIndex);
            newTypeHandler = PathTypeHandlerBase::FromTypeHandler(type->GetTypeHandler());
            if (attr == ObjectSlotAttr_Setter)
            {
                PropertyIndex getterIndex = newTypeHandler->GetTypePath()->LookupInline(propertyId, newTypeHandler->GetPathLength());
                Assert(getterIndex != Constants::NoSlot);
                if (attributes[getterIndex] & ObjectSlotAttr_Accessor)
                {
                    newTypeHandler->SetSetterSlot(getterIndex, (PathTypeSetterSlotIndex)(newTypeHandler->GetPathLength() - 1));
                }
            }
        }
        Assert(newTypeHandler->GetPathLength() == GetPathLength());
        Assert(newTypeHandler->GetPropertyCount() == GetPropertyCount());
        Assert(newTypeHandler->GetSetterCount() == GetSetterCount());

        *typeRef = type;

        return newTypeHandler;
    }